

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O1

void __thiscall CRPCCommand::CRPCCommand(CRPCCommand *this,string category,RpcMethodFnType fn)

{
  string name;
  Actor actor;
  code *in_RDX;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffdd8;
  undefined8 uVar1;
  code *pcVar2;
  code *pcVar3;
  undefined8 in_stack_fffffffffffffe18;
  _Alloc_hider in_stack_fffffffffffffe20;
  _Manager_type in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  _Vector_impl_data in_stack_fffffffffffffe38;
  _Manager_type local_1b0;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  vector<RPCArg,_std::allocator<RPCArg>_> local_180;
  vector<RPCResult,_std::allocator<RPCResult>_> local_168;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  long *local_128;
  long local_120;
  long local_118 [2];
  undefined1 local_108 [16];
  code *local_f8;
  long *local_e8;
  long local_d8 [2];
  vector<RPCArg,_std::allocator<RPCArg>_> local_c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b0;
  long *local_98;
  long local_88 [3];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)fn,*(long *)(fn + 8) + *(long *)fn);
  (*in_RDX)(&local_128);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_128,local_120 + (long)local_128);
  uVar1 = 0;
  pcVar3 = std::
           _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.h:107:15)>
           ::_M_invoke;
  pcVar2 = std::
           _Function_handler<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.h:107:15)>
           ::_M_manager;
  (*in_RDX)(&stack0xfffffffffffffe20);
  RPCHelpMan::GetArgNames_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)&stack0xfffffffffffffde0,(RPCHelpMan *)&stack0xfffffffffffffe20);
  name._M_string_length = uVar1;
  name._M_dataplus._M_p = (pointer)in_RDX;
  name.field_2._M_allocated_capacity = (size_type)pcVar2;
  name.field_2._8_8_ = pcVar3;
  actor.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffe20._M_p;
  actor.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffe18;
  actor.super__Function_base._M_manager = in_stack_fffffffffffffe28;
  actor._M_invoker = (_Invoker_type)in_stack_fffffffffffffe30;
  CRPCCommand(this,in_stack_fffffffffffffdd8,name,actor,
              (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               )in_stack_fffffffffffffe38,(intptr_t)local_50);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)&stack0xfffffffffffffde0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_p != &local_140) {
    operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_168);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
  }
  if (local_1b0 != (_Manager_type)0x0) {
    (*local_1b0)((_Any_data *)&stack0xfffffffffffffe40,(_Any_data *)&stack0xfffffffffffffe40,
                 __destroy_functor);
  }
  if (in_stack_fffffffffffffe20._M_p != &stack0xfffffffffffffe30) {
    operator_delete(in_stack_fffffffffffffe20._M_p,(ulong)(in_stack_fffffffffffffe30 + 1));
  }
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(&stack0xfffffffffffffdf8,&stack0xfffffffffffffdf8,3);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_c8);
  if (local_e8 != local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(local_108,local_108,3);
  }
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRPCCommand(std::string category, RpcMethodFnType fn)
        : CRPCCommand(
              category,
              fn().m_name,
              [fn](const JSONRPCRequest& request, UniValue& result, bool) { result = fn().HandleRequest(request); return true; },
              fn().GetArgNames(),
              intptr_t(fn))
    {
    }